

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

uchar * __thiscall
cimg_library::CImg<unsigned_char>::max_min<float>(CImg<unsigned_char> *this,float *min_val)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  CImgInstanceException *this_00;
  byte bVar4;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  
  pbVar2 = this->_data;
  if ((((pbVar2 != (byte *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    bVar4 = *pbVar2;
    uVar7 = this->_depth * this->_spectrum * this->_height * this->_width;
    pbVar3 = pbVar2;
    if (uVar7 != 0) {
      pbVar5 = pbVar2 + uVar7;
      bVar6 = bVar4;
      do {
        pbVar5 = pbVar5 + -1;
        bVar1 = *pbVar5;
        if (bVar6 < bVar1) {
          pbVar3 = pbVar5;
          bVar6 = bVar1;
        }
        if (bVar1 < bVar4) {
          bVar4 = bVar1;
        }
      } while (pbVar2 < pbVar5);
    }
    *min_val = (float)bVar4;
    return pbVar3;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar8 = "non-";
  if (this->_is_shared != false) {
    pcVar8 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min() : Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar8,"unsigned char");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min() : Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }